

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_2::ColorVerifier::ColorVerifier
          (ColorVerifier *this,Vec3 *_color,int _threshold)

{
  float x_;
  float y_;
  float z_;
  Vector<float,_4> local_2c;
  int local_1c;
  Vec3 *pVStack_18;
  int _threshold_local;
  Vec3 *_color_local;
  ColorVerifier *this_local;
  
  local_1c = _threshold;
  pVStack_18 = _color;
  _color_local = (Vec3 *)this;
  Verifier::Verifier(&this->super_Verifier);
  (this->super_Verifier)._vptr_Verifier = (_func_int **)&PTR_verify_011c0490;
  x_ = tcu::Vector<float,_3>::x(pVStack_18);
  y_ = tcu::Vector<float,_3>::y(pVStack_18);
  z_ = tcu::Vector<float,_3>::z(pVStack_18);
  tcu::Vector<float,_4>::Vector(&local_2c,x_,y_,z_,1.0);
  tcu::RGBA::RGBA(&this->m_color,&local_2c);
  tcu::Vector<int,_3>::Vector(&this->m_threshold,local_1c);
  return;
}

Assistant:

ColorVerifier (const tcu::Vec3& _color, int _threshold = 8)
		: m_color		(tcu::Vec4(_color.x(), _color.y(), _color.z(), 1.0f))
		, m_threshold	(tcu::IVec3(_threshold))
	{
	}